

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceVkImpl::RenderDeviceVkImpl
          (RenderDeviceVkImpl *this,IReferenceCounters *pRefCounters,
          IMemoryAllocator *RawMemAllocator,IEngineFactory *pEngineFactory,
          EngineVkCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo,size_t CommandQueueCount,
          ICommandQueueVk **CmdQueues,shared_ptr<VulkanUtilities::VulkanInstance> Instance,
          unique_ptr<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          PhysicalDevice,shared_ptr<VulkanUtilities::VulkanLogicalDevice> LogicalDevice)

{
  VulkanPhysicalDevice *pVVar1;
  VulkanLogicalDevice *LogicalDevice_00;
  pointer pvVar2;
  pointer pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *pRVar5;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *pRVar6;
  undefined1 auVar7 [8];
  uint Value;
  IMemoryAllocator *pIVar8;
  ICommandQueueVk *pIVar9;
  iterator iVar10;
  element_type *peVar11;
  uint uVar12;
  ulong uVar13;
  Uint32 fmt;
  ulong uVar14;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorPoolSize> __l_00;
  HardwareQueueIndex QueueFamilyIndex;
  SoftwareQueueIndex local_189;
  DescriptorPoolManager *local_188;
  DescriptorSetAllocator *local_180;
  VulkanMemoryManager *local_178;
  VulkanDynamicMemoryManager *local_170;
  unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_> *local_168;
  IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> local_159;
  RenderDeviceVkImpl *local_158;
  RenderDeviceVkImpl *local_150;
  vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
  *local_148;
  _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_140;
  unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_> *local_138;
  unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
  *local_130;
  EngineVkCreateInfo *local_128;
  undefined1 local_120 [8];
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  VALIDATION_FLAGS VStack_108;
  undefined4 uStack_104;
  DEVICE_FEATURE_STATE DStack_101;
  Char local_100 [7];
  DEVICE_FEATURE_STATE DStack_f9;
  undefined4 local_f8;
  Char local_f4 [12];
  Char local_e8 [8];
  Char local_e0 [8];
  Char local_d8 [8];
  Char local_d0 [8];
  Char local_c8 [8];
  string local_c0;
  string local_a0;
  string local_80;
  _Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_60;
  _Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> local_48;
  
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::RenderDeviceNextGenBase
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ,pRefCounters,RawMemAllocator,pEngineFactory,CommandQueueCount,CmdQueues,
             (EngineCreateInfo *)EngineCI,AdapterInfo);
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.super_ObjectBase<Diligent::IRenderDeviceVk>
  .super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject = (IObject)&PTR_QueryInterface_00895a30;
  (this->m_Properties).UploadHeapPageSize = *(Uint32 *)(EngineCI + 0x130);
  (this->m_Properties).DynamicHeapPageSize = *(Uint32 *)(EngineCI + 0x138);
  std::__shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_VulkanInstance).
              super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2> *)
             Instance.
             super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  (this->m_PhysicalDevice)._M_t.
  super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  ._M_t.
  super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl =
       (VulkanPhysicalDevice *)
       (Instance.super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi)->_vptr__Sp_counted_base;
  (Instance.super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  (this->m_LogicalVkDevice).
  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)PhysicalDevice._M_t.
                   super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                   .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                   _M_head_impl + 8);
  *(undefined8 *)
   ((long)PhysicalDevice._M_t.
          super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          ._M_t.
          super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl + 8) =
       0;
  (this->m_LogicalVkDevice).
  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)
        PhysicalDevice._M_t.
        super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
        ._M_t.
        super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
        .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  (this->m_LogicalVkDevice).
  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  *(undefined8 *)
   PhysicalDevice._M_t.
   super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
   ._M_t.
   super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
   .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl = 0;
  local_130 = &this->m_FramebufferCache;
  local_138 = &this->m_ImplicitRenderPassCache;
  (this->m_FramebufferCache)._M_t.
  super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
  .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl = (FramebufferCache *)0x0
  ;
  (this->m_ImplicitRenderPassCache)._M_t.
  super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>.
  _M_t.
  super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
  .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl = (RenderPassCache *)0x0;
  std::__cxx11::string::string((string *)&local_80,"Main descriptor pool",(allocator *)&local_150);
  local_120 = (undefined1  [8])((ulong)*(uint *)(EngineCI + 0xcc) << 0x20);
  uStack_118._0_1_ = DEVICE_FEATURE_STATE_ENABLED;
  uStack_118._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_118._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_118._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_114 = *(undefined4 *)(EngineCI + 0xd0);
  local_110._0_1_ = DEVICE_FEATURE_STATE_OPTIONAL;
  local_110._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_110._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_110._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_10c = *(undefined4 *)(EngineCI + 0xd4);
  VStack_108 = 3;
  uStack_104 = *(undefined4 *)(EngineCI + 0xd8);
  local_100[0] = '\x04';
  local_100[1] = '\0';
  local_100[2] = '\0';
  local_100[3] = '\0';
  unique0x00011f80 = *(undefined4 *)(EngineCI + 0xe4);
  local_f8._0_1_ = '\x05';
  local_f8._1_1_ = '\0';
  local_f8._2_1_ = '\0';
  local_f8._3_1_ = '\0';
  local_f4._0_4_ = *(undefined4 *)(EngineCI + 0xe8);
  local_f4[4] = '\x06';
  local_f4[5] = '\0';
  local_f4[6] = '\0';
  local_f4[7] = '\0';
  local_f4._8_4_ = *(undefined4 *)(EngineCI + 0xdc);
  local_e8[0] = '\a';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8._4_4_ = *(undefined4 *)(EngineCI + 0xe0);
  local_e0[0] = '\b';
  local_e0[1] = '\0';
  local_e0[2] = '\0';
  local_e0[3] = '\0';
  local_d8[0] = '\t';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d0[0] = '\n';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0._4_4_ = *(undefined4 *)(EngineCI + 0xec);
  local_c8[0] = -0x10;
  local_c8[1] = '\x13';
  local_c8[2] = -99;
  local_c8[3] = ';';
  local_c8._4_4_ = *(undefined4 *)(EngineCI + 0xf0);
  __l._M_len = 0xc;
  __l._M_array = (iterator)local_120;
  local_e0._4_4_ = local_f4._8_4_;
  local_d8._4_4_ = local_e8._4_4_;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_48,__l,
             (allocator_type *)&QueueFamilyIndex);
  DescriptorSetAllocator::DescriptorSetAllocator
            (&this->m_DescriptorSetAllocator,this,&local_80,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_48,
             *(uint32_t *)(EngineCI + 200),true);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            (&local_48);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string
            ((string *)&local_a0,"Dynamic descriptor pool",(allocator *)&local_150);
  local_120 = (undefined1  [8])((ulong)*(uint *)(EngineCI + 0xf8) << 0x20);
  uStack_118._0_1_ = DEVICE_FEATURE_STATE_ENABLED;
  uStack_118._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_118._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_118._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_114 = *(undefined4 *)(EngineCI + 0xfc);
  local_110._0_1_ = DEVICE_FEATURE_STATE_OPTIONAL;
  local_110._1_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_110._2_1_ = DEVICE_FEATURE_STATE_DISABLED;
  local_110._3_1_ = DEVICE_FEATURE_STATE_DISABLED;
  uStack_10c = *(undefined4 *)(EngineCI + 0x100);
  VStack_108 = 3;
  uStack_104 = *(undefined4 *)(EngineCI + 0x104);
  local_100[0] = '\x04';
  local_100[1] = '\0';
  local_100[2] = '\0';
  local_100[3] = '\0';
  unique0x00011f80 = *(undefined4 *)(EngineCI + 0x110);
  local_f8._0_1_ = '\x05';
  local_f8._1_1_ = '\0';
  local_f8._2_1_ = '\0';
  local_f8._3_1_ = '\0';
  local_f4._0_4_ = *(undefined4 *)(EngineCI + 0x114);
  local_f4[4] = '\x06';
  local_f4[5] = '\0';
  local_f4[6] = '\0';
  local_f4[7] = '\0';
  local_f4._8_4_ = *(undefined4 *)(EngineCI + 0x108);
  local_e8[0] = '\a';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '\0';
  local_e8._4_4_ = *(undefined4 *)(EngineCI + 0x10c);
  local_e0[0] = '\b';
  local_e0[1] = '\0';
  local_e0[2] = '\0';
  local_e0[3] = '\0';
  local_d8[0] = '\t';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d0[0] = '\n';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0._4_4_ = *(undefined4 *)(EngineCI + 0xec);
  local_c8[0] = -0x10;
  local_c8[1] = '\x13';
  local_c8[2] = -99;
  local_c8[3] = ';';
  local_c8._4_4_ = *(undefined4 *)(EngineCI + 0xf0);
  __l_00._M_len = 0xc;
  __l_00._M_array = (iterator)local_120;
  local_e0._4_4_ = local_f4._8_4_;
  local_d8._4_4_ = local_e8._4_4_;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_60,__l_00
             ,(allocator_type *)&QueueFamilyIndex);
  DescriptorPoolManager::DescriptorPoolManager
            (&this->m_DynamicDescriptorPool,this,&local_a0,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_60,
             *(uint32_t *)(EngineCI + 0xf4),false);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            (&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  local_140 = &(this->m_TransientCmdPoolMgrs)._M_h;
  (this->m_TransientCmdPoolMgrs)._M_h._M_buckets =
       &(this->m_TransientCmdPoolMgrs)._M_h._M_single_bucket;
  (this->m_TransientCmdPoolMgrs)._M_h._M_bucket_count = 1;
  (this->m_TransientCmdPoolMgrs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_TransientCmdPoolMgrs)._M_h._M_element_count = 0;
  (this->m_TransientCmdPoolMgrs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148 = (vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
               *)&this->m_QueryMgrs;
  (this->m_TransientCmdPoolMgrs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_TransientCmdPoolMgrs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_QueryMgrs).
  super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_QueryMgrs).
  super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_QueryMgrs).
  super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&local_c0,"Global resource memory manager",(allocator *)local_120);
  pVVar1 = (this->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  LogicalDevice_00 =
       (this->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188 = &this->m_DynamicDescriptorPool;
  local_180 = &this->m_DescriptorSetAllocator;
  pIVar8 = GetRawAllocator();
  local_178 = &this->m_MemoryMgr;
  VulkanUtilities::VulkanMemoryManager::VulkanMemoryManager
            (local_178,&local_c0,LogicalDevice_00,pVVar1,pIVar8,(ulong)*(uint *)(EngineCI + 0x120),
             (ulong)*(uint *)(EngineCI + 0x124),(ulong)*(uint *)(EngineCI + 0x128),
             (ulong)*(uint *)(EngineCI + 300));
  std::__cxx11::string::~string((string *)&local_c0);
  pIVar8 = GetRawAllocator();
  local_170 = &this->m_DynamicMemoryManager;
  VulkanDynamicMemoryManager::VulkanDynamicMemoryManager
            (local_170,pIVar8,this,*(Uint32 *)(EngineCI + 0x134),0xffffffffffffffff);
  local_168 = &this->m_pDxCompiler;
  uVar14 = 1;
  CreateDXCompiler((Diligent *)local_168,Vulkan,
                   ((this->m_PhysicalDevice)._M_t.
                    super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                    .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                   _M_head_impl)->m_VkVersion,*(char **)(EngineCI + 0x158));
  peVar11 = (this->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_158 = this;
  if ((peVar11->m_EnabledExtFeatures).DynamicRendering.dynamicRendering == 0) {
    std::make_unique<Diligent::FramebufferCache,Diligent::RenderDeviceVkImpl&>
              ((RenderDeviceVkImpl *)local_120);
    auVar7 = local_120;
    local_120._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_120._4_4_ = 0;
    std::
    __uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
    reset((__uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
           *)local_130,(pointer)auVar7);
    std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
    ~unique_ptr((unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
                 *)local_120);
    std::make_unique<Diligent::RenderPassCache,Diligent::RenderDeviceVkImpl&>
              ((RenderDeviceVkImpl *)local_120);
    auVar7 = local_120;
    local_120._0_4_ = VK_DESCRIPTOR_TYPE_SAMPLER;
    local_120._4_4_ = 0;
    std::__uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
    ::reset((__uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
             *)local_138,(pointer)auVar7);
    std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
    ~unique_ptr((unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
                 *)local_120);
    peVar11 = (this->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  }
  pVVar1 = (this->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  uVar12 = pVVar1->m_VkVersion;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Type =
       RENDER_DEVICE_TYPE_VULKAN;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.APIVersion =
       (Version)(CONCAT44(uVar12 >> 0xc,uVar12 >> 0x16) & 0x3ff0000007f);
  VkFeaturesToDeviceFeatures
            ((DeviceFeatures *)local_120,uVar12,&peVar11->m_EnabledFeatures,&pVVar1->m_Properties,
             &peVar11->m_EnabledExtFeatures,&pVVar1->m_ExtProperties,DEVICE_FEATURE_STATE_ENABLED);
  pRVar5 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer8BitAccess = DStack_101;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceStaticArrays = (char)local_100._0_4_;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceRuntimeArrays = SUB41(local_100._0_4_,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.WaveOp =
       SUB41(local_100._0_4_,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  InstanceDataStepRate = SUB41(local_100._0_4_,3);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.NativeFence =
       (char)local_100._4_3_;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.TileShaders =
       SUB31(local_100._4_3_,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TransferQueueTimestampQueries = SUB31(local_100._4_3_,2);
  pRVar5 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  VariableRateShading = DStack_f9;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SparseResources = (char)local_f8;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SubpassFramebufferFetch = SUB41(local_f8,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureComponentSwizzle = SUB41(local_f8,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureSubresourceViews = SUB41(local_f8,3);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  NativeMultiDraw = (char)local_f4._0_3_;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  AsyncShaderCompilation = SUB31(local_f4._0_3_,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  FormattedBuffers = SUB31(local_f4._0_3_,2);
  pRVar5 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.DepthClamp =
       (char)local_110;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  IndependentBlend = SUB41(local_110,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DualSourceBlend = SUB41(local_110,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.MultiViewport
       = SUB41(local_110,3);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureCompressionBC = (char)uStack_10c;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureCompressionETC2 = SUB41(uStack_10c,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  VertexPipelineUAVWritesAndAtomics = SUB41(uStack_10c,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  PixelUAVWritesAndAtomics = SUB41(uStack_10c,3);
  pRVar5 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TextureUAVExtendedFormats = (char)VStack_108;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.ShaderFloat16
       = (char)(VStack_108 >> 8);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ResourceBuffer16BitAccess = (char)(VStack_108 >> 0x10);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer16BitAccess = (char)(VStack_108 >> 0x18);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderInputOutput16 = (char)uStack_104;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.ShaderInt8 =
       SUB41(uStack_104,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ResourceBuffer8BitAccess = SUB41(uStack_104,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  UniformBuffer8BitAccess = SUB41(uStack_104,3);
  pRVar5 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  SeparablePrograms = local_120[0];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ShaderResourceQueries = local_120[1];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.WireframeFill
       = local_120[2];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  MultithreadedResourceCreation = local_120[3];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  ComputeShaders = local_120[4];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  GeometryShaders = local_120[5];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.Tessellation
       = local_120[6];
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.MeshShaders =
       local_120[7];
  pRVar5 = &this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.RayTracing =
       (char)uStack_118;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  BindlessResources = SUB41(uStack_118,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  OcclusionQueries = SUB41(uStack_118,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  BinaryOcclusionQueries = SUB41(uStack_118,3);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  TimestampQueries = (char)uStack_114;
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  PipelineStatisticsQueries = SUB41(uStack_114,1);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DurationQueries = SUB41(uStack_114,2);
  (pRVar5->super_RenderDeviceBase<Diligent::EngineVkImplTraits>).m_DeviceInfo.Features.
  DepthBiasClamp = SUB41(uStack_114,3);
  pRVar6 = &(this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
  (pRVar6->m_DeviceInfo).MaxShaderVersion.HLSL.Major = 5;
  (pRVar6->m_DeviceInfo).MaxShaderVersion.HLSL.Minor = 1;
  pRVar6 = &(this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
  (pRVar6->m_DeviceInfo).MaxShaderVersion.GLSL.Major = 4;
  (pRVar6->m_DeviceInfo).MaxShaderVersion.GLSL.Minor = 6;
  pRVar6 = &(this->
            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>;
  (pRVar6->m_DeviceInfo).MaxShaderVersion.GLESSL.Major = 3;
  (pRVar6->m_DeviceInfo).MaxShaderVersion.GLESSL.Minor = 2;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.MinZ = 0.0;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.ZtoDepthScale = 1.0;
  (this->
  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.NDC.YtoVScale = -0.5;
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::reserve((vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
             *)local_148,CommandQueueCount);
  uVar13 = 0;
  local_128 = EngineCI;
  while (uVar12 = (uint)uVar13, uVar13 < CommandQueueCount) {
    IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
    IndexWrapper<unsigned_int,unsigned_int>
              ((IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> *)&local_189,uVar12);
    pIVar9 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ::GetCommandQueue(&local_158->
                                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                               ,local_189);
    Value = (*(pIVar9->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar9);
    IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
    IndexWrapper<unsigned_int,unsigned_int>
              ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)&QueueFamilyIndex,
               Value);
    iVar10 = std::
             _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(local_140,(key_type *)&QueueFamilyIndex);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_120 = (undefined1  [8])
                  (local_158->m_LogicalVkDevice).
                  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      std::__cxx11::string::string
                ((string *)&uStack_118,"Transient command buffer pool manager",
                 (allocator *)&local_150);
      local_f8._0_1_ = QueueFamilyIndex.m_Value;
      local_f4[0] = '\x01';
      local_f4[1] = '\0';
      local_f4[2] = '\0';
      local_f4[3] = '\0';
      std::
      _Hashtable<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>,std::__detail::_Select1st,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const&,Diligent::CommandPoolManager::CreateInfo>
                ((_Hashtable<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>,std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>,std::allocator<std::pair<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>const,Diligent::CommandPoolManager>>,std::__detail::_Select1st,std::equal_to<Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>>,Diligent::IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_140,
                 (IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)&QueueFamilyIndex,
                 (unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
                  *)local_120);
      std::__cxx11::string::~string((string *)&uStack_118);
    }
    local_150 = local_158;
    IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
    IndexWrapper<unsigned_int,unsigned_int>(&local_159,uVar12);
    std::
    make_unique<Diligent::QueryManagerVk,Diligent::RenderDeviceVkImpl*,unsigned_int_const(&)[6],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>>
              ((RenderDeviceVkImpl **)local_120,(uint (*) [6])&local_150,
               (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)(EngineCI + 0x13c));
    std::
    vector<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>,std::allocator<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>>
    ::
    emplace_back<std::unique_ptr<Diligent::QueryManagerVk,std::default_delete<Diligent::QueryManagerVk>>>
              (local_148,
               (unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
                *)local_120);
    std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>::
    ~unique_ptr((unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
                 *)local_120);
    uVar13 = (ulong)(uVar12 + 1);
  }
  pvVar2 = (local_158->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo.
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (local_158->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TextureFormatsInfo.
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (; uVar14 < (ulong)(((long)pvVar3 - (long)pvVar2) / 0x28); uVar14 = (ulong)((int)uVar14 + 1))
  {
    pvVar2[uVar14].super_TextureFormatInfo.Supported = true;
  }
  RenderDeviceBase<Diligent::EngineVkImplTraits>::InitShaderCompilationThreadPool
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)local_158,
             *(IThreadPool **)(local_128 + 0x60),*(Uint32 *)(local_128 + 0x68));
  return;
}

Assistant:

RenderDeviceVkImpl::RenderDeviceVkImpl(IReferenceCounters*                                    pRefCounters,
                                       IMemoryAllocator&                                      RawMemAllocator,
                                       IEngineFactory*                                        pEngineFactory,
                                       const EngineVkCreateInfo&                              EngineCI,
                                       const GraphicsAdapterInfo&                             AdapterInfo,
                                       size_t                                                 CommandQueueCount,
                                       ICommandQueueVk**                                      CmdQueues,
                                       std::shared_ptr<VulkanUtilities::VulkanInstance>       Instance,
                                       std::unique_ptr<VulkanUtilities::VulkanPhysicalDevice> PhysicalDevice,
                                       std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>  LogicalDevice) :
    // clang-format off
    TRenderDeviceBase
    {
        pRefCounters,
        RawMemAllocator,
        pEngineFactory,
        CommandQueueCount,
        CmdQueues,
        EngineCI,
        AdapterInfo
    },
    m_Properties
    {
        EngineCI.UploadHeapPageSize,
        EngineCI.DynamicHeapPageSize
    },
    m_VulkanInstance         {Instance                 },
    m_PhysicalDevice         {std::move(PhysicalDevice)},
    m_LogicalVkDevice        {std::move(LogicalDevice) },
    m_DescriptorSetAllocator
    {
        *this,
        "Main descriptor pool",
        std::vector<VkDescriptorPoolSize>
        {
            {VK_DESCRIPTOR_TYPE_SAMPLER,                    EngineCI.MainDescriptorPoolSize.NumSeparateSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,     EngineCI.MainDescriptorPoolSize.NumCombinedSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,              EngineCI.MainDescriptorPoolSize.NumSampledImageDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,              EngineCI.MainDescriptorPoolSize.NumStorageImageDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,       EngineCI.MainDescriptorPoolSize.NumUniformTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,       EngineCI.MainDescriptorPoolSize.NumStorageTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,             EngineCI.MainDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,             EngineCI.MainDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC,     EngineCI.MainDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC,     EngineCI.MainDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,           EngineCI.MainDescriptorPoolSize.NumInputAttachmentDescriptors},
            {VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR, EngineCI.MainDescriptorPoolSize.NumAccelStructDescriptors}
        },
        EngineCI.MainDescriptorPoolSize.MaxDescriptorSets,
        true
    },
    m_DynamicDescriptorPool
    {
        *this,
        "Dynamic descriptor pool",
        std::vector<VkDescriptorPoolSize>
        {
            {VK_DESCRIPTOR_TYPE_SAMPLER,                    EngineCI.DynamicDescriptorPoolSize.NumSeparateSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,     EngineCI.DynamicDescriptorPoolSize.NumCombinedSamplerDescriptors},
            {VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,              EngineCI.DynamicDescriptorPoolSize.NumSampledImageDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,              EngineCI.DynamicDescriptorPoolSize.NumStorageImageDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER,       EngineCI.DynamicDescriptorPoolSize.NumUniformTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,       EngineCI.DynamicDescriptorPoolSize.NumStorageTexelBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,             EngineCI.DynamicDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,             EngineCI.DynamicDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC,     EngineCI.DynamicDescriptorPoolSize.NumUniformBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC,     EngineCI.DynamicDescriptorPoolSize.NumStorageBufferDescriptors},
            {VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,           EngineCI.MainDescriptorPoolSize.NumInputAttachmentDescriptors},
            {VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR, EngineCI.MainDescriptorPoolSize.NumAccelStructDescriptors}
        },
        EngineCI.DynamicDescriptorPoolSize.MaxDescriptorSets,
        false // Pools can only be reset
    },
    m_MemoryMgr
    {
        "Global resource memory manager",
        *m_LogicalVkDevice,
        *m_PhysicalDevice,
        GetRawAllocator(),
        EngineCI.DeviceLocalMemoryPageSize,
        EngineCI.HostVisibleMemoryPageSize,
        EngineCI.DeviceLocalMemoryReserveSize,
        EngineCI.HostVisibleMemoryReserveSize
    },
    m_DynamicMemoryManager
    {
        GetRawAllocator(),
        *this,
        EngineCI.DynamicHeapSize,
        ~Uint64{0}
    },
    m_pDxCompiler{CreateDXCompiler(DXCompilerTarget::Vulkan, m_PhysicalDevice->GetVkVersion(), EngineCI.pDxCompilerPath)}
// clang-format on
{
    if (!m_LogicalVkDevice->GetEnabledExtFeatures().DynamicRendering.dynamicRendering)
    {
        m_FramebufferCache        = std::make_unique<FramebufferCache>(*this);
        m_ImplicitRenderPassCache = std::make_unique<RenderPassCache>(*this);
    }

    static_assert(sizeof(VulkanDescriptorPoolSize) == sizeof(Uint32) * 11, "Please add new descriptors to m_DescriptorSetAllocator and m_DynamicDescriptorPool constructors");

    const uint32_t vkVersion = m_PhysicalDevice->GetVkVersion();
    m_DeviceInfo.Type        = RENDER_DEVICE_TYPE_VULKAN;
    m_DeviceInfo.APIVersion  = Version{VK_API_VERSION_MAJOR(vkVersion), VK_API_VERSION_MINOR(vkVersion)};

    m_DeviceInfo.Features = VkFeaturesToDeviceFeatures(vkVersion,
                                                       m_LogicalVkDevice->GetEnabledFeatures(),
                                                       m_PhysicalDevice->GetProperties(),
                                                       m_LogicalVkDevice->GetEnabledExtFeatures(),
                                                       m_PhysicalDevice->GetExtProperties());

    m_DeviceInfo.MaxShaderVersion.HLSL   = {5, 1};
    m_DeviceInfo.MaxShaderVersion.GLSL   = {4, 6};
    m_DeviceInfo.MaxShaderVersion.GLESSL = {3, 2};

    // Note that Vulkan itself does not invert Y coordinate when transforming
    // normalized device Y to window space. However, we use negative viewport
    // height which achieves the same effect as in D3D, therefore we need to
    // invert y (see comments in DeviceContextVkImpl::CommitViewports() for details)
    m_DeviceInfo.NDC = NDCAttribs{0.0f, 1.0f, -0.5f};

    // Every queue family needs its own command pool.
    // Every queue needs its own query pool.
    m_QueryMgrs.reserve(CommandQueueCount);
    for (Uint32 q = 0; q < CommandQueueCount; ++q)
    {
        const HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(SoftwareQueueIndex{q}).GetQueueFamilyIndex()};

        if (m_TransientCmdPoolMgrs.find(QueueFamilyIndex) == m_TransientCmdPoolMgrs.end())
        {
            m_TransientCmdPoolMgrs.emplace(
                QueueFamilyIndex,
                CommandPoolManager::CreateInfo{
                    //
                    GetLogicalDevice(),
                    "Transient command buffer pool manager",
                    QueueFamilyIndex,
                    VK_COMMAND_POOL_CREATE_TRANSIENT_BIT //
                });
        }

        m_QueryMgrs.emplace_back(std::make_unique<QueryManagerVk>(this, EngineCI.QueryPoolSizes, SoftwareQueueIndex{q}));
    }

    for (Uint32 fmt = 1; fmt < m_TextureFormatsInfo.size(); ++fmt)
        m_TextureFormatsInfo[fmt].Supported = true; // We will test every format on a specific hardware device

    InitShaderCompilationThreadPool(EngineCI.pAsyncShaderCompilationThreadPool, EngineCI.NumAsyncShaderCompilationThreads);
}